

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions(EnvironmentNAVXYTHETALATTICE *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  sbpl_xy_theta_pt_t pose_00;
  sbpl_xy_theta_pt_t pose_01;
  sbpl_xy_theta_pt_t pose_02;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong *puVar11;
  char cVar12;
  int iVar13;
  long *in_RDI;
  ulong uVar14;
  int targettheta;
  sbpl_xy_theta_pt_t pose;
  int targettheta_1;
  sbpl_xy_theta_pt_t pose_1;
  double angle;
  int aind;
  sbpl_xy_theta_pt_t sourcepose;
  int tind;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  value_type *ppEVar15;
  EnvNAVXYTHETALATAction_t *in_stack_fffffffffffffd90;
  EnvNAVXYTHETALATAction_t *pEVar16;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_fffffffffffffda0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffdd8;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffde0;
  ulong *local_200;
  ulong *local_1d0;
  double in_stack_fffffffffffffe80;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_fffffffffffffe88;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea0;
  long in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  sbpl_xy_theta_pt_t local_f0;
  long local_d8;
  int local_cc;
  value_type *local_c8;
  EnvNAVXYTHETALATAction_t *pEStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_98;
  sbpl_xy_theta_pt_t local_78;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_60;
  int local_54;
  sbpl_xy_theta_pt_t local_50;
  int local_24;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)in_RDI[6];
  uVar8 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  in_RDI[0x1d] = (long)pvVar9;
  uVar8 = (ulong)(int)in_RDI[6];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar10 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar14 = uVar10 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar10) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar14);
  *puVar11 = uVar8;
  puVar11 = puVar11 + 1;
  if (uVar8 != 0) {
    local_1d0 = puVar11;
    do {
      std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::vector
                ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
                 0x16db9b);
      local_1d0 = local_1d0 + 3;
    } while (local_1d0 != puVar11 + uVar8 * 3);
  }
  in_RDI[0x1e] = (long)puVar11;
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16dbe0);
  for (local_24 = 0; local_24 < (int)in_RDI[6]; local_24 = local_24 + 1) {
    uVar8 = (ulong)(int)in_RDI[0x1f];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    uVar10 = SUB168(auVar4 * ZEXT816(0x68),0);
    uVar14 = uVar10 + 8;
    if (0xfffffffffffffff7 < uVar10) {
      uVar14 = 0xffffffffffffffff;
    }
    if (SUB168(auVar4 * ZEXT816(0x68),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    puVar11 = (ulong *)operator_new__(uVar14);
    *puVar11 = uVar8;
    puVar11 = puVar11 + 1;
    if (uVar8 != 0) {
      local_200 = puVar11;
      do {
        EnvNAVXYTHETALATAction_t::EnvNAVXYTHETALATAction_t(in_stack_fffffffffffffd90);
        local_200 = local_200 + 0xd;
      } while (local_200 != puVar11 + uVar8 * 0xd);
    }
    *(ulong **)(in_RDI[0x1d] + (long)local_24 * 8) = puVar11;
    sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_50);
    local_50.x = (double)in_RDI[0x14] * 0.0 + (double)in_RDI[0x14] * 0.5;
    local_50.y = (double)in_RDI[0x14] * 0.0 + (double)in_RDI[0x14] * 0.5;
    local_50.theta = (double)(**(code **)(*in_RDI + 0x100))(in_RDI,local_24);
    for (local_54 = 0; cVar12 = (char)local_24, local_54 < 3; local_54 = local_54 + 1) {
      *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68) =
           (char)local_54;
      *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 1 + (long)local_54 * 0x68) = cVar12;
      *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 4 + (long)local_54 * 0x68) =
           (char)((local_24 + -1 + local_54) % (int)in_RDI[6]);
      in_stack_fffffffffffffde0 =
           (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)
           (**(code **)(*in_RDI + 0x100))
                     (in_RDI,(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 4 +
                                           (long)local_54 * 0x68));
      local_60 = in_stack_fffffffffffffde0;
      dVar5 = cos((double)in_stack_fffffffffffffde0);
      dVar6 = cos((double)local_60);
      *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 2 + (long)local_54 * 0x68) =
           (char)(int)((double)(int)(((0.0 < dVar6) - 1) + (uint)(0.0 < dVar6)) * 0.5 + dVar5);
      dVar5 = sin((double)local_60);
      dVar6 = sin((double)local_60);
      *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 3 + (long)local_54 * 0x68) =
           (char)(int)((double)(int)(((0.0 < dVar6) - 1) + (uint)(0.0 < dVar6)) * 0.5 + dVar5);
      in_stack_fffffffffffffdd8 =
           (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)
           (((double)in_RDI[0x14] * 1000.0) / (double)in_RDI[0x12]);
      lVar1 = *(long *)(in_RDI[0x1d] + (long)local_24 * 8);
      iVar7 = (int)*(char *)(lVar1 + 2 + (long)local_54 * 0x68);
      iVar13 = (int)*(char *)(lVar1 + 3 + (long)local_54 * 0x68);
      dVar5 = sqrt((double)(iVar7 * iVar7 + iVar13 * iVar13));
      dVar5 = ceil((double)in_stack_fffffffffffffdd8 * dVar5);
      *(int *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 8 + (long)local_54 * 0x68) =
           (int)dVar5;
      sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_78);
      local_78.x = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 2 +
                                         (long)local_54 * 0x68) * (double)in_RDI[0x14] +
                   (double)in_RDI[0x14] * 0.5;
      local_78.y = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 3 +
                                         (long)local_54 * 0x68) * (double)in_RDI[0x14] +
                   (double)in_RDI[0x14] * 0.5;
      local_78.theta = (double)local_60;
      std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::clear
                ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x16e0ef);
      std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
                ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16e120);
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_98 = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)local_78.theta;
      local_a8 = local_78.x;
      dStack_a0 = local_78.y;
      pose_00.y = (double)in_stack_fffffffffffffea8;
      pose_00.x = (double)in_stack_fffffffffffffea0;
      pose_00.theta._0_4_ = in_stack_fffffffffffffeb0;
      pose_00.theta._4_4_ = in_stack_fffffffffffffeb4;
      get_2d_footprint_cells
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,pose_00,
                 in_stack_fffffffffffffe80);
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffda0);
      local_b8 = local_50.theta;
      local_c8 = (value_type *)local_50.x;
      pEStack_c0 = (EnvNAVXYTHETALATAction_t *)local_50.y;
      ppEVar15 = (value_type *)local_50.x;
      pEVar16 = (EnvNAVXYTHETALATAction_t *)local_50.y;
      (**(code **)(*in_RDI + 0x220))
                (in_RDI,*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x10 + (long)local_54 * 0x68)
      ;
      local_cc = (int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68
                               + 4);
      if (local_cc < 0) {
        local_cc = local_cc + (int)in_RDI[6];
      }
      local_d8 = *(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68;
      std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
      push_back((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
                pEVar16,ppEVar15);
    }
    local_54 = 3;
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x138) = 3;
    *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x139) = cVar12;
    *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x13c) = cVar12 + -1;
    if (*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x13c) < '\0') {
      lVar1 = *(long *)(in_RDI[0x1d] + (long)local_24 * 8);
      *(char *)(lVar1 + 0x13c) = *(char *)(lVar1 + 0x13c) + (char)(int)in_RDI[6];
    }
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x13a) = 0;
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x13b) = 0;
    *(int *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x140) =
         (int)((double)in_RDI[0x13] * 1000.0);
    sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_f0);
    local_f0.x = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 2 +
                                       (long)local_54 * 0x68) * (double)in_RDI[0x14] +
                 (double)in_RDI[0x14] * 0.5;
    local_f0.y = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 3 +
                                       (long)local_54 * 0x68) * (double)in_RDI[0x14] +
                 (double)in_RDI[0x14] * 0.5;
    local_f0.theta =
         (double)(**(code **)(*in_RDI + 0x100))
                           (in_RDI,(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 4 +
                                                 (long)local_54 * 0x68));
    std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::clear
              ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x16e5f7);
    std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
              ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16e628);
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pose_01.y = (double)in_stack_fffffffffffffea8;
    pose_01.x = (double)in_stack_fffffffffffffea0;
    pose_01.theta._0_4_ = in_stack_fffffffffffffeb0;
    pose_01.theta._4_4_ = in_stack_fffffffffffffeb4;
    get_2d_footprint_cells
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,pose_01,in_stack_fffffffffffffe80
              );
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffda0);
    ppEVar15 = (value_type *)local_50.x;
    pEVar16 = (EnvNAVXYTHETALATAction_t *)local_50.y;
    (**(code **)(*in_RDI + 0x220))
              (in_RDI,*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x10 + (long)local_54 * 0x68);
    iVar7 = (int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68 + 4)
    ;
    if (iVar7 < 0) {
      iVar7 = iVar7 + (int)in_RDI[6];
    }
    in_stack_fffffffffffffea8 = *(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68
    ;
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::push_back
              ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
               pEVar16,ppEVar15);
    local_54 = 4;
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a0) = 4;
    *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a1) = (char)local_24;
    *(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a4) =
         (char)((local_24 + 1) % (int)in_RDI[6]);
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a2) = 0;
    *(undefined1 *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a3) = 0;
    *(int *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a8) =
         (int)((double)in_RDI[0x13] * 1000.0);
    local_f0.x = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a2) *
                 (double)in_RDI[0x14] + (double)in_RDI[0x14] * 0.5;
    local_f0.y = (double)(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x1a3) *
                 (double)in_RDI[0x14] + (double)in_RDI[0x14] * 0.5;
    local_f0.theta =
         (double)(**(code **)(*in_RDI + 0x100))
                           (in_RDI,(int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) +
                                                 0x1a4));
    std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::clear
              ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x16ea38);
    std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
              ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16ea69);
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pose_02.y = (double)in_stack_fffffffffffffea8;
    pose_02.x = (double)in_stack_fffffffffffffea0;
    pose_02.theta._0_4_ = in_stack_fffffffffffffeb0;
    pose_02.theta._4_4_ = iVar7;
    in_stack_fffffffffffffe80 = local_f0.y;
    in_stack_fffffffffffffe88 =
         (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)local_f0.theta;
    get_2d_footprint_cells
              (in_stack_fffffffffffffe90,
               (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)local_f0.theta,pose_02,
               local_f0.y);
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffda0);
    ppEVar15 = (value_type *)local_50.x;
    in_stack_fffffffffffffd90 = (EnvNAVXYTHETALATAction_t *)local_50.y;
    (**(code **)(*in_RDI + 0x220))
              (in_RDI,*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + 0x10 + (long)local_54 * 0x68);
    in_stack_fffffffffffffeb4 =
         (int)*(char *)(*(long *)(in_RDI[0x1d] + (long)local_24 * 8) + (long)local_54 * 0x68 + 4);
    if (in_stack_fffffffffffffeb4 < 0) {
      in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb4 + (int)in_RDI[6];
    }
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::push_back
              ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
               in_stack_fffffffffffffd90,ppEVar15);
  }
  (**(code **)(*in_RDI + 600))();
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions()
{
    SBPL_PRINTF("Use of DeprecatedPrecomputeActions() is deprecated and probably doesn't work!\n");

    // construct list of actions
    SBPL_PRINTF("Pre-computing action data using the motion primitives for a 3D kinematic planning...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;
    // iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("processing angle %d\n", tind);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[EnvNAVXYTHETALATCfg.actionwidth];

        // compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.theta = DiscTheta2ContNew(tind);

        // the construction assumes that the robot first turns and then goes
        // along this new theta
        int aind = 0;
        for (; aind < 3; aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            // -1,0,1
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + aind - 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
            double angle = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = (int)(cos(angle) + 0.5 * (cos(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = (int)(sin(angle) + 0.5 * (sin(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM *
                    EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs *
                    sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));

            // compute intersecting cells
            sbpl_xy_theta_pt_t pose;
            pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.theta = angle;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            get_2d_footprint_cells(
                    EnvNAVXYTHETALATCfg.FootprintPolygon,
                    &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                    pose,
                    EnvNAVXYTHETALATCfg.cellsize_m);
            RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
            SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                        tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, angle,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

            // add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) {
                targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            }
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }

        // decrease and increase angle without movement
        aind = 3;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = tind - 1;
        if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta < 0) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta += EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        sbpl_xy_theta_pt_t pose;
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                    DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) {
            targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));

        aind = 4;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
    }

    // now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data\n");
}